

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::delete_mapping(upnp *this,port_mapping_t mapping)

{
  bool bVar1;
  reference d_00;
  value_type *pvVar2;
  ulong uVar3;
  endpoint *ep;
  double __x;
  rootdevice *d;
  rootdevice *dev;
  iterator __end1;
  iterator __begin1;
  set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
  *__range1;
  string local_50;
  int local_2c;
  value_type *local_28;
  global_mapping_t *m;
  upnp *local_18;
  upnp *this_local;
  port_mapping_t mapping_local;
  
  local_18 = this;
  this_local._4_4_ = mapping.m_val;
  m._4_4_ = libtorrent::aux::
            container_wrapper<libtorrent::upnp::global_mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
            ::end_index(&this->m_mappings);
  bVar1 = libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator>=
                    ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                     ((long)&this_local + 4),
                     (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)((long)&m + 4));
  if (!bVar1) {
    local_2c = this_local._4_4_;
    local_28 = libtorrent::aux::
               container_wrapper<libtorrent::upnp::global_mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
               ::operator[](&this->m_mappings,
                            (strong_typedef<int,_libtorrent::port_mapping_tag,_void>)
                            this_local._4_4_);
    bVar1 = should_log(this);
    if (bVar1) {
      libtorrent::aux::print_endpoint_abi_cxx11_(&local_50,(aux *)&local_28->local_ep,ep);
      ::std::__cxx11::string::c_str();
      __x = (double)::std::__cxx11::string::c_str();
      log(this,__x);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    if (local_28->protocol != none) {
      __end1 = ::std::
               set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
               ::begin(&this->m_devices);
      dev = (rootdevice *)
            ::std::
            set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
            ::end(&this->m_devices);
      while (bVar1 = ::std::operator!=(&__end1,(_Self *)&dev), bVar1) {
        d_00 = ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator*(&__end1);
        if ((d_00->disabled & 1U) == 0) {
          pvVar2 = libtorrent::aux::
                   container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
                   ::operator[](&d_00->mapping,
                                (strong_typedef<int,_libtorrent::port_mapping_tag,_void>)
                                this_local._4_4_);
          (pvVar2->super_base_mapping).act = del;
          uVar3 = ::std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            update_map(this,d_00,this_local._4_4_);
          }
        }
        ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator++(&__end1);
      }
    }
  }
  return;
}

Assistant:

void upnp::delete_mapping(port_mapping_t const mapping)
{
	TORRENT_ASSERT(is_single_thread());

	if (mapping >= m_mappings.end_index()) return;

	global_mapping_t const& m = m_mappings[mapping];

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("deleting port map: [ protocol: %s ext_port: %u "
			"local_ep: %s device: %s]"
			, (m.protocol == portmap_protocol::tcp?"tcp":"udp"), m.external_port
			, print_endpoint(m.local_ep).c_str()
			, m.device.c_str());
	}
#endif

	if (m.protocol == portmap_protocol::none) return;

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;

		TORRENT_ASSERT(mapping < d.mapping.end_index());
		d.mapping[mapping].act = portmap_action::del;

		if (!d.service_namespace.empty()) update_map(d, mapping);
	}
}